

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

void server_poll_cb(uv_poll_t *handle,int status,int events)

{
  void *pvVar1;
  int iVar2;
  connection_context_t *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  socklen_t addr_len;
  sockaddr_in addr;
  
  pvVar1 = handle->data;
  addr_len = 0x10;
  iVar2 = accept(*(int *)((long)pvVar1 + 0xa0),(sockaddr *)&addr,&addr_len);
  if (iVar2 < 0) {
    pcVar5 = "sock >= 0";
    uVar4 = 0x1e8;
  }
  else {
    pcVar3 = create_connection_context(iVar2,1);
    pcVar3->events = 7;
    iVar2 = uv_poll_start(pcVar3,7,connection_poll_cb);
    if (iVar2 == 0) {
      iVar2 = *(int *)((long)pvVar1 + 0xa4) + 1;
      *(int *)((long)pvVar1 + 0xa4) = iVar2;
      if (iVar2 == 5) {
        close_socket(*(uv_os_sock_t *)((long)pvVar1 + 0xa0));
        uv_close(pvVar1,server_close_cb);
      }
      return;
    }
    pcVar5 = "r == 0";
    uVar4 = 0x1f0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-poll.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

static void server_poll_cb(uv_poll_t* handle, int status, int events) {
  server_context_t* server_context = (server_context_t*)
                                          handle->data;
  connection_context_t* connection_context;
  struct sockaddr_in addr;
  socklen_t addr_len;
  uv_os_sock_t sock;
  int r;

  addr_len = sizeof addr;
  sock = accept(server_context->sock, (struct sockaddr*) &addr, &addr_len);
#ifdef _WIN32
  ASSERT(sock != INVALID_SOCKET);
#else
  ASSERT(sock >= 0);
#endif

  connection_context = create_connection_context(sock, 1);
  connection_context->events = UV_READABLE | UV_WRITABLE | UV_DISCONNECT;
  r = uv_poll_start(&connection_context->poll_handle,
                    UV_READABLE | UV_WRITABLE | UV_DISCONNECT,
                    connection_poll_cb);
  ASSERT(r == 0);

  if (++server_context->connections == NUM_CLIENTS) {
    close_socket(server_context->sock);
    destroy_server_context(server_context);
  }
}